

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool container_iterator_read_into_uint64
                (container_t *c,uint8_t typecode,roaring_container_iterator_t *it,uint64_t high48,
                uint64_t *buf,uint32_t count,uint32_t *consumed,uint16_t *value_out)

{
  ushort uVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  byte bVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  uint32_t uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  ulong *puVar15;
  long lVar16;
  uint uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  long lVar20;
  
  *consumed = 0;
  auVar4 = _DAT_001331f0;
  auVar3 = _DAT_001331e0;
  if (count == 0) {
    return false;
  }
  if (typecode == '\x01') {
    iVar7 = it->index;
    iVar14 = iVar7 + 0x3f;
    if (-1 < iVar7) {
      iVar14 = iVar7;
    }
    uVar12 = (ulong)(uint)(iVar14 >> 6);
    lVar2 = *(long *)((long)c + 8);
    bVar5 = (byte)(iVar7 % 0x40);
    uVar8 = (*(ulong *)(lVar2 + uVar12 * 8) >> (bVar5 & 0x3f)) << (bVar5 & 0x3f);
    uVar6 = 0;
    do {
      uVar11 = (uint)uVar12;
      if (uVar8 != 0) {
        uVar9 = count;
        if (count < uVar6) {
          uVar9 = uVar6;
        }
        do {
          if (uVar9 == uVar6) goto LAB_00112788;
          lVar16 = 0;
          if (uVar8 != 0) {
            for (; (uVar8 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
            }
          }
          *buf = ((uint)lVar16 | uVar11 << 6) | high48;
          buf = buf + 1;
          uVar6 = uVar6 + 1;
          *consumed = uVar6;
          uVar8 = uVar8 & uVar8 - 1;
        } while (uVar8 != 0);
      }
      if (0x3ff < uVar11 + 1) {
        return false;
      }
      puVar15 = (ulong *)(lVar2 + (ulong)(uVar11 + 1) * 8);
      do {
        uVar11 = (int)uVar12 + 1;
        uVar12 = (ulong)uVar11;
        uVar8 = *puVar15;
        if (uVar8 != 0) break;
        puVar15 = puVar15 + 1;
      } while (uVar11 < 0x3ff);
      if (uVar8 == 0) {
        return false;
      }
    } while (uVar6 < count);
LAB_00112788:
    lVar2 = 0;
    if (uVar8 != 0) {
      for (; (uVar8 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
      }
    }
    uVar6 = (uint)lVar2 | uVar11 << 6;
    it->index = uVar6;
  }
  else {
    if (typecode != '\x02') {
      lVar2 = *(long *)((long)c + 8);
      uVar11 = (uint)*value_out;
      uVar6 = 0;
      do {
        uVar10 = (uint)*(ushort *)(lVar2 + 2 + (long)it->index * 4) +
                 (uint)*(ushort *)(lVar2 + (long)it->index * 4);
        uVar11 = uVar11 & 0xffff;
        uVar13 = (uVar10 - uVar11) + 1;
        uVar17 = count - uVar6;
        if (uVar13 < count - uVar6) {
          uVar17 = uVar13;
        }
        if (uVar17 == 0) {
          uVar8 = 0;
        }
        else {
          uVar8 = (ulong)uVar17;
          lVar16 = uVar8 - 1;
          auVar18._8_4_ = (int)lVar16;
          auVar18._0_8_ = lVar16;
          auVar18._12_4_ = (int)((ulong)lVar16 >> 0x20);
          lVar16 = 1;
          auVar18 = auVar18 ^ auVar4;
          auVar19 = auVar3;
          uVar13 = uVar11;
          do {
            auVar21 = auVar19 ^ auVar4;
            if ((bool)(~(auVar18._4_4_ < auVar21._4_4_ ||
                        auVar18._0_4_ < auVar21._0_4_ && auVar21._4_4_ == auVar18._4_4_) & 1)) {
              buf[lVar16 + -1] = uVar13 | high48;
            }
            if (auVar21._12_4_ <= auVar18._12_4_ &&
                (auVar21._8_4_ <= auVar18._8_4_ || auVar21._12_4_ != auVar18._12_4_)) {
              buf[lVar16] = uVar13 + 1 | high48;
            }
            lVar20 = auVar19._8_8_;
            auVar19._0_8_ = auVar19._0_8_ + 2;
            auVar19._8_8_ = lVar20 + 2;
            lVar20 = lVar16 - (uVar8 + 1 & 0xfffffffffffffffe);
            lVar16 = lVar16 + 2;
            uVar13 = uVar13 + 2;
          } while (lVar20 != -1);
        }
        uVar11 = uVar11 + uVar17;
        *value_out = (uint16_t)uVar11;
        uVar6 = uVar6 + uVar17;
        *consumed = uVar6;
        if (((uint16_t)uVar11 == 0) || (uVar10 < (uVar11 & 0xffff))) {
          iVar7 = it->index;
          iVar14 = iVar7 + 1;
          it->index = iVar14;
          if (*c <= iVar14) {
            return false;
          }
          uVar1 = *(ushort *)(lVar2 + 4 + (long)iVar7 * 4);
          uVar11 = (uint)uVar1;
          *value_out = uVar1;
          uVar6 = *consumed;
        }
        buf = buf + uVar8;
      } while (uVar6 < count);
      return true;
    }
    iVar7 = it->index;
    uVar6 = *c - iVar7;
    if (count <= uVar6) {
      uVar6 = count;
    }
    if (*c != iVar7) {
      lVar2 = *(long *)((long)c + 8);
      uVar8 = 0;
      do {
        buf[uVar8] = *(ushort *)(lVar2 + (ulong)(uint)(iVar7 + (int)uVar8) * 2) | high48;
        uVar8 = uVar8 + 1;
      } while (uVar6 + (uVar6 == 0) != uVar8);
    }
    *consumed = uVar6;
    iVar7 = uVar6 + it->index;
    it->index = iVar7;
    if (*c <= iVar7) {
      return false;
    }
    uVar6 = (uint)*(ushort *)(*(long *)((long)c + 8) + (long)iVar7 * 2);
  }
  *value_out = (uint16_t)uVar6;
  return true;
}

Assistant:

bool container_iterator_read_into_uint64(const container_t *c, uint8_t typecode,
                                         roaring_container_iterator_t *it,
                                         uint64_t high48, uint64_t *buf,
                                         uint32_t count, uint32_t *consumed,
                                         uint16_t *value_out) {
    *consumed = 0;
    if (count == 0) {
        return false;
    }
    switch (typecode) {
        case BITSET_CONTAINER_TYPE: {
            const bitset_container_t *bc = const_CAST_bitset(c);
            uint32_t wordindex = it->index / 64;
            uint64_t word =
                bc->words[wordindex] & (UINT64_MAX << (it->index % 64));
            do {
                // Read set bits.
                while (word != 0 && *consumed < count) {
                    *buf = high48 |
                           (wordindex * 64 + roaring_trailing_zeroes(word));
                    word = word & (word - 1);
                    buf++;
                    (*consumed)++;
                }
                // Skip unset bits.
                while (word == 0 &&
                       wordindex + 1 < BITSET_CONTAINER_SIZE_IN_WORDS) {
                    wordindex++;
                    word = bc->words[wordindex];
                }
            } while (word != 0 && *consumed < count);

            if (word != 0) {
                it->index = wordindex * 64 + roaring_trailing_zeroes(word);
                *value_out = it->index;
                return true;
            }
            return false;
        }
        case ARRAY_CONTAINER_TYPE: {
            const array_container_t *ac = const_CAST_array(c);
            uint32_t num_values =
                minimum_uint32(ac->cardinality - it->index, count);
            for (uint32_t i = 0; i < num_values; i++) {
                buf[i] = high48 | ac->array[it->index + i];
            }
            *consumed += num_values;
            it->index += num_values;
            if (it->index < ac->cardinality) {
                *value_out = ac->array[it->index];
                return true;
            }
            return false;
        }
        case RUN_CONTAINER_TYPE: {
            const run_container_t *rc = const_CAST_run(c);
            do {
                uint32_t largest_run_value =
                    rc->runs[it->index].value + rc->runs[it->index].length;
                uint32_t num_values = minimum_uint32(
                    largest_run_value - *value_out + 1, count - *consumed);
                for (uint32_t i = 0; i < num_values; i++) {
                    buf[i] = high48 | (*value_out + i);
                }
                *value_out += num_values;
                buf += num_values;
                *consumed += num_values;

                // We check for `value == 0` because `it->value += num_values`
                // can overflow when `value == UINT16_MAX`, and `count >
                // length`. In this case `value` will overflow to 0.
                if (*value_out > largest_run_value || *value_out == 0) {
                    it->index++;
                    if (it->index < rc->n_runs) {
                        *value_out = rc->runs[it->index].value;
                    } else {
                        return false;
                    }
                }
            } while (*consumed < count);
            return true;
        }
        default:
            assert(false);
            roaring_unreachable;
            return 0;
    }
}